

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma_back.c
# Opt level: O0

_Bool parse_renouveau(state *s)

{
  int iVar1;
  __ssize_t _Var2;
  undefined1 local_24 [4];
  int ret;
  ent e;
  state *s_local;
  
  local_24 = (undefined1  [4])(s->parse).addr;
  ret = 0;
  e.addr._0_1_ = 0;
  e._4_8_ = s;
  do {
    _Var2 = getline((char **)(e._4_8_ + 0xc058),(size_t *)(e._4_8_ + 0xc060),
                    *(FILE **)(e._4_8_ + 0x18));
    if (_Var2 < 0) {
      return false;
    }
    iVar1 = __isoc99_sscanf(*(undefined8 *)(e._4_8_ + 0xc058),"%x",&ret);
  } while (iVar1 != 1);
  add_ent((state *)e._4_8_,(ent *)local_24);
  *(int *)(e._4_8_ + 0xc068) = *(int *)(e._4_8_ + 0xc068) + 4;
  return true;
}

Assistant:

bool
parse_renouveau(struct state *s)
{
	struct ent e = {
		.addr = s->parse.addr
	};
	int ret;

	for (;;) {
		if (getline(&s->parse.buf, &s->parse.n, s->f) < 0)
			return false;

		ret = sscanf(s->parse.buf, "%x", &e.val);
		if (ret == 1)
			break;
	}

	add_ent(s, &e);
	s->parse.addr += 4;
	return true;
}